

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::ByteCodeWriter::RecordStartScopeObject
          (ByteCodeWriter *this,DiagExtraScopesType scopeType,RegSlot scopeLocation,int *index)

{
  FunctionBody *this_00;
  uint start;
  DebuggerScope *debuggerScope_00;
  DebuggerScope *debuggerScope;
  int *index_local;
  RegSlot scopeLocation_local;
  DiagExtraScopesType scopeType_local;
  ByteCodeWriter *this_local;
  
  index_local._0_4_ = scopeLocation;
  if (scopeLocation != 0xffffffff) {
    index_local._0_4_ = ConsumeReg(this,scopeLocation);
  }
  this_00 = this->m_functionWrite;
  start = Data::GetCurrentOffset(&this->m_byteCodeData);
  debuggerScope_00 =
       FunctionBody::RecordStartScopeObject(this_00,scopeType,start,(RegSlot)index_local,index);
  PushDebuggerScope(this,debuggerScope_00);
  return debuggerScope_00;
}

Assistant:

DebuggerScope* ByteCodeWriter::RecordStartScopeObject(DiagExtraScopesType scopeType, RegSlot scopeLocation, int* index)
    {
        if (scopeLocation != Js::Constants::NoRegister)
        {
            scopeLocation = ConsumeReg(scopeLocation);
        }
        DebuggerScope* debuggerScope = m_functionWrite->RecordStartScopeObject(scopeType, m_byteCodeData.GetCurrentOffset(), scopeLocation, index);
        PushDebuggerScope(debuggerScope);
        return debuggerScope;
    }